

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_encoding.h
# Opt level: O3

bool draco::EncodeVarint<unsigned_int>(uint val,EncoderBuffer *out_buffer)

{
  bool bVar1;
  undefined8 in_RAX;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar2;
  
  uVar2 = CONCAT17((char)val,(int7)in_RAX) & 0x7fffffffffffffff;
  if (val < 0x80) {
    if (out_buffer->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)out_buffer,
                 (out_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&stack0xffffffffffffffef,&stack0xfffffffffffffff0
                 ,in_R8,in_R9,uVar2);
      return true;
    }
  }
  else if (out_buffer->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)out_buffer,
               (out_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&stack0xffffffffffffffef,&stack0xfffffffffffffff0,
               in_R8,in_R9,CONCAT17((char)val,(int7)uVar2) | 0x8000000000000000);
    bVar1 = EncodeVarint<unsigned_int>(val >> 7,out_buffer);
    return bVar1;
  }
  return false;
}

Assistant:

bool EncodeVarint(IntTypeT val, EncoderBuffer *out_buffer) {
  if (std::is_unsigned<IntTypeT>::value) {
    // Coding of unsigned values.
    // 0-6 bit - data
    // 7 bit - next byte?
    uint8_t out = 0;
    out |= val & ((1 << 7) - 1);
    if (val >= (1 << 7)) {
      out |= (1 << 7);
      if (!out_buffer->Encode(out)) {
        return false;
      }
      if (!EncodeVarint<IntTypeT>(val >> 7, out_buffer)) {
        return false;
      }
      return true;
    }
    if (!out_buffer->Encode(out)) {
      return false;
    }
  } else {
    // IntTypeT is a signed value. Convert to unsigned symbol and encode.
    const typename std::make_unsigned<IntTypeT>::type symbol =
        ConvertSignedIntToSymbol(val);
    if (!EncodeVarint(symbol, out_buffer)) {
      return false;
    }
  }
  return true;
}